

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

Curve * __thiscall ON_ShutLining::FindCurve(ON_ShutLining *this,ON_UUID *id)

{
  bool bVar1;
  Curve *this_00;
  CurveIterator it;
  CurveIterator local_30;
  ON_UUID local_28;
  
  CurveIterator::CurveIterator(&local_30,this);
  do {
    this_00 = CurveIterator::CImpl::Next(local_30.m_impl);
    if (this_00 == (Curve *)0x0) break;
    local_28 = Curve::Id(this_00);
    bVar1 = ::operator==(&local_28,id);
  } while (!bVar1);
  CurveIterator::~CurveIterator(&local_30);
  return this_00;
}

Assistant:

ON_ShutLining::Curve* ON_ShutLining::FindCurve(const ON_UUID& id) const
{
  auto it = GetCurveIterator();
  while (Curve* curve = it.Next())
  {
    if (curve->Id() == id)
      return curve;
  }

  return nullptr;
}